

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryProvider.h
# Opt level: O2

void __thiscall
FIX::DataDictionaryProvider::addTransportDataDictionary
          (DataDictionaryProvider *this,BeginString *beginString,string *path)

{
  DataDictionary *this_00;
  __shared_ptr<FIX::DataDictionary,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_00 = (DataDictionary *)operator_new(0x3e0);
  FIX::DataDictionary::DataDictionary(this_00,(string *)path,false);
  std::__shared_ptr<FIX::DataDictionary,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<FIX::DataDictionary,void>(local_30,this_00);
  FIX::DataDictionaryProvider::addTransportDataDictionary(this,beginString,local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

void addTransportDataDictionary(const BeginString &beginString, const std::string &path) {
    addTransportDataDictionary(beginString, std::shared_ptr<DataDictionary>(new DataDictionary(path)));
  }